

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O3

void sysbvm_virtualMemory_unlockCodePagesForExecution
               (void *writePointer,void *executablePointer,size_t size)

{
  int iVar1;
  ulong uVar2;
  void *__addr;
  
  if (writePointer != executablePointer) {
    return;
  }
  iVar1 = getpagesize();
  uVar2 = -(long)iVar1;
  __addr = (void *)(uVar2 & (ulong)writePointer);
  mprotect(__addr,((long)writePointer + (long)iVar1 + size + -1 & uVar2) - (long)__addr,5);
  pthread_mutex_unlock((pthread_mutex_t *)&codeZoneWriteLock);
  return;
}

Assistant:

void sysbvm_virtualMemory_unlockCodePagesForExecution(void *writePointer, void *executablePointer, size_t size)
{
    if(writePointer != executablePointer)
        return;

    size_t pageAlignment = sysbvm_virtualMemory_getSystemAllocationAlignment();
    uintptr_t startAddress = (uintptr_t)executablePointer & (-pageAlignment);
    uintptr_t endAddress = ((uintptr_t)executablePointer + size + pageAlignment - 1) & (-pageAlignment);

    mprotect((void*)startAddress, endAddress - startAddress, PROT_READ | PROT_EXEC);
    pthread_mutex_unlock(&codeZoneWriteLock);
}